

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void write_int(uchar **cp,int i)

{
  uchar *puVar1;
  uchar *c;
  int i_local;
  uchar **cp_local;
  
  puVar1 = *cp;
  *puVar1 = (uchar)i;
  puVar1[1] = (uchar)((uint)i >> 8);
  puVar1[2] = (uchar)((uint)i >> 0x10);
  puVar1[3] = (uchar)((uint)i >> 0x18);
  *cp = puVar1 + 4;
  return;
}

Assistant:

static void write_int(unsigned char **cp,int i){
  unsigned char *c=*cp;
  *c++=i&0xFF;i>>=8;
  *c++=i&0xFF;i>>=8;
  *c++=i&0xFF;i>>=8;
  *c++=i&0xFF;i>>=8;
  *cp=c;
}